

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall VertexAttrib64Bit::VAOTest::initBufferObjects(VAOTest *this)

{
  uint uVar1;
  GLenum GVar2;
  
  (*(this->super_Base).gl.genBuffers)(1,&this->m_bo_id_1);
  (*(this->super_Base).gl.genBuffers)(1,&this->m_bo_id_2);
  (*(this->super_Base).gl.genBuffers)(1,&this->m_bo_id_indices);
  (*(this->super_Base).gl.genBuffers)(1,&this->m_bo_id_result);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glGenBuffers() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd6e);
  (*(this->super_Base).gl.bindBuffer)(0x8892,this->m_bo_id_1);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd72);
  (*(this->super_Base).gl.bufferData)(0x8892,(ulong)this->m_bo_1_data_size,this->m_bo_1_data,0x88e4)
  ;
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd75);
  (*(this->super_Base).gl.bindBuffer)(0x8892,this->m_bo_id_2);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd78);
  (*(this->super_Base).gl.bufferData)(0x8892,(ulong)this->m_bo_2_data_size,this->m_bo_2_data,0x88e4)
  ;
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd7b);
  (*(this->super_Base).gl.bindBuffer)(0x8893,this->m_bo_id_indices);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd7e);
  (*(this->super_Base).gl.bufferData)
            (0x8893,(ulong)this->m_bo_index_data_size,this->m_bo_index_data,0x88e4);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd81);
  uVar1 = this->m_n_draw_call_instances;
  (*(this->super_Base).gl.bindBuffer)(0x8892,this->m_bo_id_result);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd97);
  (*(this->super_Base).gl.bufferData)(0x8892,(ulong)(uVar1 * 0x2b000),(void *)0x0,0x88e4);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd9a);
  (*(this->super_Base).gl.bindBuffer)(0x8c8e,this->m_bo_id_result);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd9e);
  (*(this->super_Base).gl.bindBufferBase)(0x8c8e,0,this->m_bo_id_result);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xda1);
  return;
}

Assistant:

void VAOTest::initBufferObjects()
{
	DE_ASSERT(m_bo_1_data != DE_NULL);
	DE_ASSERT(m_bo_2_data != DE_NULL);

	/* Generate BOs */
	gl.genBuffers(1, &m_bo_id_1);
	gl.genBuffers(1, &m_bo_id_2);
	gl.genBuffers(1, &m_bo_id_indices);
	gl.genBuffers(1, &m_bo_id_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call(s) failed.");

	/* Initiailize BO storage */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, m_bo_1_data_size, m_bo_1_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id_2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, m_bo_2_data_size, m_bo_2_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_bo_id_indices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, m_bo_index_data_size, m_bo_index_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Finally, reserve sufficient amount of space for the data to be XFBed out from
	 * the test program. We need:
	 *
	 * a) dmat3:   (3 * 3 * 2) components: 18 float components
	 * b) float:   (1)         component :  1 float component
	 * c) dvec2:   (2 * 2)     components:  4 float components
	 * d) double:  (1 * 2)     components:  2 float components
	 * e) dmat4x2: (4 * 2 * 2) components: 16 float components
	 * f) int:     (1)         components:  1 int   component
	 * g) float:   (1)         component:   1 float components
	 *                                 (+)------
	 *                                    (42 float + 1 int) components times 1024 batches: 43008 floats, 1024 ints
	 *
	 * Don't forget about instanced draw calls. We'll be XFBing data for either 1 or m_n_draw_call_instances
	 * instances.
	 */
	const unsigned int xfb_data_size =
		static_cast<unsigned int>((42 * sizeof(float) + sizeof(int)) * 1024 * m_n_draw_call_instances);

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, xfb_data_size, DE_NULL /* data */, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Set up XFB bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");
}